

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.h
# Opt level: O2

int __thiscall soplex::NameSet::number(NameSet *this,char *str)

{
  bool bVar1;
  int iVar2;
  DataKey *k;
  Name nam;
  
  nam.name = str;
  bVar1 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::has(&this->hashtab,&nam);
  if (bVar1) {
    k = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::get(&this->hashtab,&nam);
    iVar2 = DataSet<int>::number(&this->set,k);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int number(const char* str) const
   {
      const Name nam(str);

      if(hashtab.has(nam))
      {
         assert(hashtab.get(nam) != nullptr);
         return number(*hashtab.get(nam));
      }
      else
         return -1;
   }